

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_UInt32 tt_cmap4_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_UInt32 FVar1;
  FT_UInt FVar2;
  FT_UInt32 FVar3;
  
  FVar3 = 0;
  if (*pchar_code < 0xffff) {
    if ((cmap->flags & 1) != 0) {
      FVar2 = tt_cmap4_char_map_linear(cmap,pchar_code,'\x01');
      return FVar2;
    }
    if (*pchar_code != *(uint *)&cmap[1].cmap.charmap.face) {
      FVar2 = tt_cmap4_char_map_binary(cmap,pchar_code,'\x01');
      return FVar2;
    }
    tt_cmap4_next((TT_CMap4)cmap);
    FVar1 = *(FT_UInt32 *)((long)&cmap[1].cmap.charmap.face + 4);
    FVar3 = 0;
    if (FVar1 != 0) {
      *pchar_code = *(FT_UInt32 *)&cmap[1].cmap.charmap.face;
      FVar3 = FVar1;
    }
  }
  return FVar3;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap4_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_UInt  gindex;


    if ( *pchar_code >= 0xFFFFU )
      return 0;

    if ( cmap->flags & TT_CMAP_FLAG_UNSORTED )
      gindex = tt_cmap4_char_map_linear( cmap, pchar_code, 1 );
    else
    {
      TT_CMap4  cmap4 = (TT_CMap4)cmap;


      /* no need to search */
      if ( *pchar_code == cmap4->cur_charcode )
      {
        tt_cmap4_next( cmap4 );
        gindex = cmap4->cur_gindex;
        if ( gindex )
          *pchar_code = cmap4->cur_charcode;
      }
      else
        gindex = tt_cmap4_char_map_binary( cmap, pchar_code, 1 );
    }

    return gindex;
  }